

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_rope::build_graph(test_rope *this,ggml_context *ctx)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ggml_tensor *pgVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  array<long,_4UL> ne;
  
  if ((this->v & 1) == 0) {
    uVar2 = ggml_new_tensor(ctx,this->type,4,&this->ne_a);
    test_case::add_sentinel(&this->super_test_case,ctx);
    if (this->forward == true) {
      ggml_set_param(ctx,uVar2);
    }
    pcVar8 = "a";
  }
  else {
    ne._M_elems[3]._0_4_ = (undefined4)(this->ne_a)._M_elems[3];
    ne._M_elems[3]._4_4_ = *(undefined4 *)((long)(this->ne_a)._M_elems + 0x1c);
    ne._M_elems[0] = (this->ne_a)._M_elems[0] << 1;
    ne._M_elems[1] = (this->ne_a)._M_elems[1] << 2;
    ne._M_elems[2] = (this->ne_a)._M_elems[2] * 3;
    lVar3 = ggml_new_tensor(ctx,this->type,4);
    test_case::add_sentinel(&this->super_test_case,ctx);
    if (this->forward == true) {
      ggml_set_param(ctx,lVar3);
    }
    ggml_set_name(lVar3,"a");
    uVar2 = ggml_view_4d(ctx,lVar3,(this->ne_a)._M_elems[0],(this->ne_a)._M_elems[1],
                         (this->ne_a)._M_elems[2],(this->ne_a)._M_elems[3],
                         *(undefined4 *)(lVar3 + 0x38),*(undefined8 *)(lVar3 + 0x40),
                         *(undefined8 *)(lVar3 + 0x48),0);
    pcVar8 = "view_of_a";
  }
  ggml_set_name(uVar2,pcVar8);
  uVar1 = this->mode;
  lVar3 = (this->ne_a)._M_elems[2];
  lVar7 = lVar3 * 4;
  if ((uVar1 & 8) == 0) {
    lVar7 = lVar3;
  }
  uVar4 = ggml_new_tensor_1d(ctx,0x1a,lVar7);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar4,"pos");
  if (this->ff == true) {
    uVar5 = ggml_new_tensor_1d(ctx,0,(long)(this->n_dims / 2));
    test_case::add_sentinel(&this->super_test_case,ctx);
    ggml_set_name(uVar5,"freq");
  }
  else {
    uVar5 = 0;
  }
  if ((uVar1 & 8) == 0) {
    if (this->forward == true) {
      pgVar6 = (ggml_tensor *)
               ggml_rope_ext(0x461c4000,ctx,uVar2,uVar4,uVar5,this->n_dims,this->mode,0);
    }
    else {
      pgVar6 = (ggml_tensor *)
               ggml_rope_ext_back(0x461c4000,this->fs,this->ef,this->af,0x3f800000,0x3f800000,ctx,
                                  uVar2,uVar4,uVar5,this->n_dims,this->mode,0);
    }
  }
  else {
    uVar9 = this->n_dims;
    if (uVar1 == 0x18) {
      if ((int)uVar9 < 4) {
        pcVar8 = "n_dims/4 > 0";
        uVar2 = 0xa1b;
LAB_0013d8f0:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                   ,uVar2,"GGML_ASSERT(%s) failed",pcVar8);
      }
      ne._M_elems[0] = CONCAT44(uVar9 >> 2,uVar9 >> 2);
      ne._M_elems[1] = 0;
      uVar9 = uVar9 >> 1;
    }
    else {
      if ((int)uVar9 < 3) {
        pcVar8 = "n_dims/3 > 0";
        uVar2 = 0xa23;
        goto LAB_0013d8f0;
      }
      ne._M_elems[0] = CONCAT44(uVar9 / 3,uVar9 / 3);
      ne._M_elems[1] = (long)(uVar9 / 3);
    }
    if (this->forward == true) {
      pgVar6 = (ggml_tensor *)
               ggml_rope_multi(0x461c4000,ctx,uVar2,uVar4,uVar5,uVar9,&ne,this->mode,0);
    }
    else {
      pgVar6 = (ggml_tensor *)
               ggml_rope_multi_back
                         (0x461c4000,this->fs,this->ef,this->af,0x3f800000,0x3f800000,ctx,uVar2,
                          uVar4,uVar5,uVar9,&ne,this->mode,0);
    }
  }
  ggml_set_name(pgVar6,"out");
  return pgVar6;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");
        }

        const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
        const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

        ggml_tensor * pos;
        if (is_mrope || is_vision) {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2] * 4);
        } else {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2]);
        }
        ggml_set_name(pos, "pos");

        ggml_tensor * freq = nullptr;
        if (ff) {
            freq = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_dims/2);
            ggml_set_name(freq, "freq");
        }

        ggml_tensor * out;
        if (is_mrope) {
            if (is_vision) {
                GGML_ASSERT(n_dims/4 > 0);
                int rope_sections[4] = {n_dims/4, n_dims/4, 0, 0}; // Vision-RoPE only use first two dimension for image (x, y) coordinate
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            } else {
                GGML_ASSERT(n_dims/3 > 0);
                int rope_sections[4] = {n_dims/3, n_dims/3, n_dims/3, 0};
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            }
        } else {
            if (forward) {
                out = ggml_rope_ext     (ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            } else {
                out = ggml_rope_ext_back(ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            }
        }
        ggml_set_name(out, "out");

        return out;
    }